

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

void M3x3_MulVector(double (*m) [3],double *v,double *product)

{
  double dVar1;
  int i;
  long lVar2;
  long lVar3;
  double temp [3];
  
  lVar2 = 0;
  do {
    temp[lVar2] = 0.0;
    dVar1 = 0.0;
    lVar3 = 0;
    do {
      dVar1 = dVar1 + (*m)[lVar3] * v[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    temp[lVar2] = dVar1;
    lVar2 = lVar2 + 1;
    m = m + 1;
  } while (lVar2 != 3);
  product[2] = temp[2];
  *product = temp[0];
  product[1] = temp[1];
  return;
}

Assistant:

void M3x3_MulVector(const double m[3][3], const double v[3], double product[3])
{
    int i, j;
    double temp[3];

    for (i=0 ; i<3 ; i++)
    {
        temp[i] = 0.0;

        for (j=0 ; j<3 ; j++)
        {
            temp[i] += m[i][j] * v[j];
        }
    }
    memcpy(product, temp, 3*sizeof(double));
}